

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int EncodeStreamHook(void *input,void *data2)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint32_t *unaff_RBP;
  long *in_RDI;
  undefined8 unaff_R13;
  VP8LBackwardRefs *unaff_R14;
  VP8LHashChain *unaff_R15;
  VP8LBitWriter *unaff_retaddr;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  CrunchConfig *in_stack_00000038;
  int *in_stack_00000040;
  int in_stack_00000048;
  size_t in_stack_00000050;
  int *in_stack_00000058;
  int entropy_idx;
  VP8LBitWriter bw_best;
  VP8LBitWriter bw_init;
  size_t best_size;
  int idx;
  int use_delta_palette;
  int data_size;
  int hdr_size;
  int use_near_lossless;
  size_t byte_position;
  int height;
  int width;
  int low_effort;
  int quality;
  WebPEncodingError err;
  WebPAuxStats *stats;
  int red_and_blue_always_zero;
  int num_crunch_configs;
  CrunchConfig *crunch_configs;
  int use_cache;
  VP8LEncoder *enc;
  VP8LBitWriter *bw;
  WebPPicture *picture;
  WebPConfig *config;
  StreamEncodeContext *params;
  VP8LEncoder *in_stack_000002a0;
  int in_stack_000002ac;
  VP8LBitWriter *in_stack_000002b0;
  uint32_t *in_stack_000007d0;
  uint32_t in_stack_000007dc;
  uint32_t *in_stack_000007e0;
  WebPPicture *in_stack_000007e8;
  VP8LBitWriter *in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  uint32_t *in_stack_fffffffffffffe90;
  VP8LBitWriter *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  VP8LEncoder *in_stack_fffffffffffffea8;
  VP8LEncoder *in_stack_fffffffffffffeb0;
  VP8LEncoder *in_stack_fffffffffffffeb8;
  VP8LEncoder *in_stack_fffffffffffffec0;
  byte local_135;
  undefined4 local_134;
  undefined1 in_stack_fffffffffffffed0;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  VP8LEncoder *in_stack_fffffffffffffed8;
  VP8LBitWriter local_f8;
  size_t local_c8;
  int local_bc;
  int local_b8;
  undefined1 local_b4 [8];
  uint local_ac;
  VP8LEncoder *local_a8;
  VP8LEncoderARGBContent local_9c;
  undefined4 local_98;
  uint local_94;
  int local_90;
  WebPEncodingError local_8c;
  long local_88;
  int local_80;
  int local_7c;
  long local_78;
  int local_6c;
  long local_68;
  VP8LBitWriter *local_60;
  long local_58;
  long local_50;
  long *local_48;
  
  local_50 = *in_RDI;
  local_58 = in_RDI[1];
  local_60 = (VP8LBitWriter *)in_RDI[2];
  local_68 = in_RDI[3];
  local_6c = (int)in_RDI[4];
  local_78 = (long)in_RDI + 0x24;
  local_7c = *(int *)((long)in_RDI + 0x104);
  local_80 = (int)in_RDI[0x21];
  local_88 = in_RDI[0x22];
  local_8c = VP8_ENC_OK;
  local_90 = (int)*(float *)(local_50 + 4);
  local_94 = (uint)(*(int *)(local_50 + 8) == 0);
  local_98 = *(undefined4 *)(local_58 + 8);
  local_9c = *(VP8LEncoderARGBContent *)(local_58 + 0xc);
  local_48 = in_RDI;
  local_a8 = (VP8LEncoder *)VP8LBitWriterNumBytes(local_60);
  local_ac = 0;
  local_b4._4_4_ = 0;
  local_b4._0_4_ = 0;
  local_b8 = 0;
  local_c8 = 0xffffffffffffffff;
  memcpy(&local_f8,local_60,0x30);
  iVar1 = VP8LBitWriterInit((VP8LBitWriter *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (size_t)in_stack_fffffffffffffe78);
  if ((iVar1 == 0) ||
     ((1 < local_7c &&
      (iVar1 = VP8LBitWriterClone((VP8LBitWriter *)
                                  CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                                  (VP8LBitWriter *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
      iVar1 == 0)))) {
    local_8c = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  else {
    for (local_bc = 0; local_bc < local_7c; local_bc = local_bc + 1) {
      iVar1 = *(int *)(local_78 + (long)local_bc * 0x1c);
      uVar6 = iVar1 == 4 || iVar1 == 5;
      *(uint *)(local_68 + 0x5c) = (uint)(byte)uVar6;
      uVar5 = iVar1 == 2 || iVar1 == 3;
      *(uint *)(local_68 + 0x54) = (uint)(byte)uVar5;
      uVar4 = true;
      if ((iVar1 != 1) && (uVar4 = true, iVar1 != 3)) {
        uVar4 = iVar1 == 5;
      }
      *(uint *)(local_68 + 0x58) = (uint)(byte)uVar4;
      if ((local_94 == 0) && (*(int *)(local_68 + 0x5c) == 0)) {
        if (local_80 == 0) {
          local_134 = *(undefined4 *)(local_68 + 0x58);
        }
        else {
          local_134 = 0;
        }
        *(undefined4 *)(local_68 + 0x50) = local_134;
      }
      else {
        *(undefined4 *)(local_68 + 0x50) = 0;
      }
      *(undefined4 *)(local_68 + 0x4c) = 0;
      VP8LBackwardRefsClear
                ((VP8LBackwardRefs *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      VP8LBackwardRefsClear
                ((VP8LBackwardRefs *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      local_135 = 0;
      if ((*(int *)(local_50 + 0x5c) < 100) && (local_135 = 0, *(int *)(local_68 + 0x5c) == 0)) {
        local_135 = *(int *)(local_68 + 0x58) != 0 ^ 0xff;
      }
      local_ac = (uint)(local_135 & 1);
      if (local_ac == 0) {
        *(undefined4 *)(local_68 + 0x18) = 0;
      }
      else {
        local_8c = AllocateTransformBuffer
                             (in_stack_fffffffffffffec0,
                              (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                              (int)in_stack_fffffffffffffeb8);
        if (local_8c != VP8_ENC_OK) goto LAB_0017f7b9;
        if ((*(int *)(local_68 + 0x18) != 2) &&
           (iVar2 = VP8ApplyNearLossless
                              ((WebPPicture *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                               (uint32_t *)in_stack_fffffffffffffe98), iVar2 == 0)) {
          local_8c = VP8_ENC_ERROR_OUT_OF_MEMORY;
          goto LAB_0017f7b9;
        }
        *(undefined4 *)(local_68 + 0x18) = 2;
      }
      if (*(int *)(local_68 + 0x5c) != 0) {
        if (*(int *)(local_78 + (long)local_bc * 0x1c + 4) == 0) {
          memcpy((void *)(local_68 + 100),(void *)(local_68 + 0x464),
                 (long)*(int *)(local_68 + 0x60) << 2);
        }
        else if (*(int *)(local_78 + (long)local_bc * 0x1c + 4) == 1) {
          PaletteSortMinimizeDeltas
                    ((uint32_t *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
        }
        else {
          local_8c = PaletteSortModifiedZeng
                               (in_stack_000007e8,in_stack_000007e0,in_stack_000007dc,
                                in_stack_000007d0);
          if (local_8c != VP8_ENC_OK) goto LAB_0017f7b9;
          local_8c = VP8_ENC_OK;
        }
        local_8c = EncodePalette(in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
        if ((local_8c != VP8_ENC_OK) ||
           (local_8c = MapImageFromPalette(in_stack_fffffffffffffed8,iVar1), local_8c != VP8_ENC_OK)
           ) goto LAB_0017f7b9;
        if ((local_6c != 0) && (*(int *)(local_68 + 0x60) < 0x400)) {
          iVar2 = BitsLog2Floor(*(uint32_t *)(local_68 + 0x60));
          *(int *)(local_68 + 0x4c) = iVar2 + 1;
        }
      }
      if (local_b8 == 0) {
        if ((*(int *)(local_68 + 0x18) != 2) && (*(int *)(local_68 + 0x18) != 3)) {
          local_8c = MakeInputImageCopy(in_stack_fffffffffffffea8);
          if (local_8c != VP8_ENC_OK) goto LAB_0017f7b9;
          local_8c = VP8_ENC_OK;
        }
        if (*(int *)(local_68 + 0x54) != 0) {
          ApplySubtractGreen((VP8LEncoder *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                             (int)in_stack_fffffffffffffe78,(VP8LBitWriter *)0x17f403);
        }
        if (*(int *)(local_68 + 0x58) != 0) {
          in_stack_fffffffffffffe78 = local_60;
          local_8c = ApplyPredictFilter(in_stack_fffffffffffffeb8,
                                        (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                                        (int)in_stack_fffffffffffffeb0,
                                        (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                                        (int)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                                        (VP8LBitWriter *)
                                        CONCAT44(iVar1,CONCAT13(uVar6,CONCAT12(uVar5,CONCAT11(uVar4,
                                                  in_stack_fffffffffffffed0)))));
          if (local_8c != VP8_ENC_OK) goto LAB_0017f7b9;
          local_8c = VP8_ENC_OK;
        }
        if (*(int *)(local_68 + 0x50) != 0) {
          local_8c = ApplyCrossColorFilter
                               (in_stack_fffffffffffffeb0,
                                (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                                (int)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                                in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          if (local_8c != VP8_ENC_OK) goto LAB_0017f7b9;
          local_8c = VP8_ENC_OK;
        }
      }
      VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                  (int)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe90 = (uint32_t *)(local_78 + (long)local_bc * 0x1c);
      in_stack_fffffffffffffe98 = (VP8LBitWriter *)(local_68 + 0x4c);
      in_stack_fffffffffffffea0 = *(int *)(local_68 + 0x44);
      in_stack_fffffffffffffeb0 = (VP8LEncoder *)(local_b4 + 4);
      in_stack_fffffffffffffeb8 = (VP8LEncoder *)local_b4;
      in_stack_fffffffffffffe78 =
           (VP8LBitWriter *)CONCAT44((int)((ulong)in_stack_fffffffffffffe78 >> 0x20),local_90);
      in_stack_fffffffffffffe80 = local_94;
      in_stack_fffffffffffffea8 = local_a8;
      local_8c = EncodeImageInternal(unaff_retaddr,unaff_RBP,unaff_R15,unaff_R14,SUB84(unaff_R13,4),
                                     (uint32_t)unaff_R13,in_stack_00000020,in_stack_00000028,
                                     in_stack_00000030,in_stack_00000038,in_stack_00000040,
                                     in_stack_00000048,in_stack_00000050,in_stack_00000058,
                                     (int *)bw_best.bits_);
      if (local_8c != VP8_ENC_OK) goto LAB_0017f7b9;
      sVar3 = VP8LBitWriterNumBytes(local_60);
      if (sVar3 < local_c8) {
        local_c8 = VP8LBitWriterNumBytes(local_60);
        VP8LBitWriterSwap((VP8LBitWriter *)in_stack_fffffffffffffeb0,
                          (VP8LBitWriter *)in_stack_fffffffffffffea8);
        if (local_88 != 0) {
          *(undefined4 *)(local_88 + 0x94) = 0;
          if (*(int *)(local_68 + 0x58) != 0) {
            *(uint *)(local_88 + 0x94) = *(uint *)(local_88 + 0x94) | 1;
          }
          if (*(int *)(local_68 + 0x50) != 0) {
            *(uint *)(local_88 + 0x94) = *(uint *)(local_88 + 0x94) | 2;
          }
          if (*(int *)(local_68 + 0x54) != 0) {
            *(uint *)(local_88 + 0x94) = *(uint *)(local_88 + 0x94) | 4;
          }
          if (*(int *)(local_68 + 0x5c) != 0) {
            *(uint *)(local_88 + 0x94) = *(uint *)(local_88 + 0x94) | 8;
          }
          *(undefined4 *)(local_88 + 0x98) = *(undefined4 *)(local_68 + 0x44);
          *(undefined4 *)(local_88 + 0x9c) = *(undefined4 *)(local_68 + 0x48);
          *(undefined4 *)(local_88 + 0xa0) = *(undefined4 *)(local_68 + 0x4c);
          *(undefined4 *)(local_88 + 0xa4) = *(undefined4 *)(local_68 + 0x60);
          *(int *)(local_88 + 0xa8) = (int)local_c8 - (int)local_a8;
          *(undefined4 *)(local_88 + 0xac) = local_b4._4_4_;
          *(undefined4 *)(local_88 + 0xb0) = local_b4._0_4_;
        }
      }
      if (1 < local_7c) {
        VP8LBitWriterReset(&local_f8,local_60);
      }
    }
    VP8LBitWriterSwap((VP8LBitWriter *)in_stack_fffffffffffffeb0,
                      (VP8LBitWriter *)in_stack_fffffffffffffea8);
  }
LAB_0017f7b9:
  VP8LBitWriterWipeOut((VP8LBitWriter *)0x17f7c3);
  *(WebPEncodingError *)((long)local_48 + 0x10c) = local_8c;
  return (int)(local_8c == VP8_ENC_OK);
}

Assistant:

static int EncodeStreamHook(void* input, void* data2) {
  StreamEncodeContext* const params = (StreamEncodeContext*)input;
  const WebPConfig* const config = params->config_;
  const WebPPicture* const picture = params->picture_;
  VP8LBitWriter* const bw = params->bw_;
  VP8LEncoder* const enc = params->enc_;
  const int use_cache = params->use_cache_;
  const CrunchConfig* const crunch_configs = params->crunch_configs_;
  const int num_crunch_configs = params->num_crunch_configs_;
  const int red_and_blue_always_zero = params->red_and_blue_always_zero_;
#if !defined(WEBP_DISABLE_STATS)
  WebPAuxStats* const stats = params->stats_;
#endif
  WebPEncodingError err = VP8_ENC_OK;
  const int quality = (int)config->quality;
  const int low_effort = (config->method == 0);
#if (WEBP_NEAR_LOSSLESS == 1)
  const int width = picture->width;
#endif
  const int height = picture->height;
  const size_t byte_position = VP8LBitWriterNumBytes(bw);
#if (WEBP_NEAR_LOSSLESS == 1)
  int use_near_lossless = 0;
#endif
  int hdr_size = 0;
  int data_size = 0;
  int use_delta_palette = 0;
  int idx;
  size_t best_size = ~(size_t)0;
  VP8LBitWriter bw_init = *bw, bw_best;
  (void)data2;

  if (!VP8LBitWriterInit(&bw_best, 0) ||
      (num_crunch_configs > 1 && !VP8LBitWriterClone(bw, &bw_best))) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  for (idx = 0; idx < num_crunch_configs; ++idx) {
    const int entropy_idx = crunch_configs[idx].entropy_idx_;
    enc->use_palette_ =
        (entropy_idx == kPalette) || (entropy_idx == kPaletteAndSpatial);
    enc->use_subtract_green_ =
        (entropy_idx == kSubGreen) || (entropy_idx == kSpatialSubGreen);
    enc->use_predict_ = (entropy_idx == kSpatial) ||
                        (entropy_idx == kSpatialSubGreen) ||
                        (entropy_idx == kPaletteAndSpatial);
    // When using a palette, R/B==0, hence no need to test for cross-color.
    if (low_effort || enc->use_palette_) {
      enc->use_cross_color_ = 0;
    } else {
      enc->use_cross_color_ = red_and_blue_always_zero ? 0 : enc->use_predict_;
    }
    // Reset any parameter in the encoder that is set in the previous iteration.
    enc->cache_bits_ = 0;
    VP8LBackwardRefsClear(&enc->refs_[0]);
    VP8LBackwardRefsClear(&enc->refs_[1]);

#if (WEBP_NEAR_LOSSLESS == 1)
    // Apply near-lossless preprocessing.
    use_near_lossless = (config->near_lossless < 100) && !enc->use_palette_ &&
                        !enc->use_predict_;
    if (use_near_lossless) {
      err = AllocateTransformBuffer(enc, width, height);
      if (err != VP8_ENC_OK) goto Error;
      if ((enc->argb_content_ != kEncoderNearLossless) &&
          !VP8ApplyNearLossless(picture, config->near_lossless, enc->argb_)) {
        err = VP8_ENC_ERROR_OUT_OF_MEMORY;
        goto Error;
      }
      enc->argb_content_ = kEncoderNearLossless;
    } else {
      enc->argb_content_ = kEncoderNone;
    }
#else
    enc->argb_content_ = kEncoderNone;
#endif

    // Encode palette
    if (enc->use_palette_) {
      if (crunch_configs[idx].palette_sorting_type_ == kSortedDefault) {
        // Nothing to do, we have already sorted the palette.
        memcpy(enc->palette_, enc->palette_sorted_,
               enc->palette_size_ * sizeof(*enc->palette_));
      } else if (crunch_configs[idx].palette_sorting_type_ == kMinimizeDelta) {
        PaletteSortMinimizeDeltas(enc->palette_sorted_, enc->palette_size_,
                                  enc->palette_);
      } else {
        assert(crunch_configs[idx].palette_sorting_type_ == kModifiedZeng);
        err = PaletteSortModifiedZeng(enc->pic_, enc->palette_sorted_,
                                      enc->palette_size_, enc->palette_);
        if (err != VP8_ENC_OK) goto Error;
      }
      err = EncodePalette(bw, low_effort, enc);
      if (err != VP8_ENC_OK) goto Error;
      err = MapImageFromPalette(enc, use_delta_palette);
      if (err != VP8_ENC_OK) goto Error;
      // If using a color cache, do not have it bigger than the number of
      // colors.
      if (use_cache && enc->palette_size_ < (1 << MAX_COLOR_CACHE_BITS)) {
        enc->cache_bits_ = BitsLog2Floor(enc->palette_size_) + 1;
      }
    }
    if (!use_delta_palette) {
      // In case image is not packed.
      if (enc->argb_content_ != kEncoderNearLossless &&
          enc->argb_content_ != kEncoderPalette) {
        err = MakeInputImageCopy(enc);
        if (err != VP8_ENC_OK) goto Error;
      }

      // -----------------------------------------------------------------------
      // Apply transforms and write transform data.

      if (enc->use_subtract_green_) {
        ApplySubtractGreen(enc, enc->current_width_, height, bw);
      }

      if (enc->use_predict_) {
        err = ApplyPredictFilter(enc, enc->current_width_, height, quality,
                                 low_effort, enc->use_subtract_green_, bw);
        if (err != VP8_ENC_OK) goto Error;
      }

      if (enc->use_cross_color_) {
        err = ApplyCrossColorFilter(enc, enc->current_width_, height, quality,
                                    low_effort, bw);
        if (err != VP8_ENC_OK) goto Error;
      }
    }

    VP8LPutBits(bw, !TRANSFORM_PRESENT, 1);  // No more transforms.

    // -------------------------------------------------------------------------
    // Encode and write the transformed image.
    err = EncodeImageInternal(bw, enc->argb_, &enc->hash_chain_, enc->refs_,
                              enc->current_width_, height, quality, low_effort,
                              use_cache, &crunch_configs[idx],
                              &enc->cache_bits_, enc->histo_bits_,
                              byte_position, &hdr_size, &data_size);
    if (err != VP8_ENC_OK) goto Error;

    // If we are better than what we already have.
    if (VP8LBitWriterNumBytes(bw) < best_size) {
      best_size = VP8LBitWriterNumBytes(bw);
      // Store the BitWriter.
      VP8LBitWriterSwap(bw, &bw_best);
#if !defined(WEBP_DISABLE_STATS)
      // Update the stats.
      if (stats != NULL) {
        stats->lossless_features = 0;
        if (enc->use_predict_) stats->lossless_features |= 1;
        if (enc->use_cross_color_) stats->lossless_features |= 2;
        if (enc->use_subtract_green_) stats->lossless_features |= 4;
        if (enc->use_palette_) stats->lossless_features |= 8;
        stats->histogram_bits = enc->histo_bits_;
        stats->transform_bits = enc->transform_bits_;
        stats->cache_bits = enc->cache_bits_;
        stats->palette_size = enc->palette_size_;
        stats->lossless_size = (int)(best_size - byte_position);
        stats->lossless_hdr_size = hdr_size;
        stats->lossless_data_size = data_size;
      }
#endif
    }
    // Reset the bit writer for the following iteration if any.
    if (num_crunch_configs > 1) VP8LBitWriterReset(&bw_init, bw);
  }
  VP8LBitWriterSwap(&bw_best, bw);

Error:
  VP8LBitWriterWipeOut(&bw_best);
  params->err_ = err;
  // The hook should return false in case of error.
  return (err == VP8_ENC_OK);
}